

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_ar.c
# Opt level: O1

void test_read_format_ar(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *pcVar3;
  time_t tVar4;
  la_int64_t lVar5;
  la_ssize_t lVar6;
  archive_entry *ae;
  char reffile [23];
  char buff [64];
  archive_entry *local_a0;
  char local_98 [32];
  undefined1 local_78 [72];
  
  builtin_strncpy(local_98,"test_read_format_ar.ar",0x17);
  extract_reference_file(local_98);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'&',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'\'',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'(',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,local_98,7);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L')',(uint)(wVar2 == L'\0'),"0 == archive_read_open_filename(a, reffile, 7)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L',',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
             ,L'-',"//","\"//\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar4 = archive_entry_mtime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'.',0,"0",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_uid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'/',0,"0",lVar5,"archive_entry_uid(ae)",(void *)0x0);
  lVar5 = archive_entry_gid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'0',0,"0",lVar5,"archive_entry_gid(ae)",(void *)0x0);
  lVar5 = archive_entry_size(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'1',0,"0",lVar5,"archive_entry_size(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'2',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'3',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'6',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
             ,L'7',"yyytttsssaaafff.o","\"yyytttsssaaafff.o\"",pcVar3,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  tVar4 = archive_entry_mtime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'8',0x46102eb4,"1175465652",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_uid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'9',0x3e9,"1001",lVar5,"archive_entry_uid(ae)",(void *)0x0);
  lVar5 = archive_entry_gid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L':',0,"0",lVar5,"archive_entry_gid(ae)",(void *)0x0);
  lVar5 = archive_entry_size(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L';',(uint)(lVar5 == 8),"8 == archive_entry_size(ae)",(void *)0x0);
  lVar6 = archive_read_data((archive *)a,local_78,10);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'<',(uint)(lVar6 == 8),"8 == archive_read_data(a, buff, 10)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'=',local_78,"buff","55667788","\"55667788\"",8,"8",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'>',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'?',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'B',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
             ,L'C',"gghh.o","\"gghh.o\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar4 = archive_entry_mtime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'D',0x46102ec4,"1175465668",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_uid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'E',0x3e9,"1001",lVar5,"archive_entry_uid(ae)",(void *)0x0);
  lVar5 = archive_entry_gid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'F',0,"0",lVar5,"archive_entry_gid(ae)",(void *)0x0);
  lVar5 = archive_entry_size(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'G',(uint)(lVar5 == 4),"4 == archive_entry_size(ae)",(void *)0x0);
  lVar6 = archive_read_data((archive *)a,local_78,10);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'H',(uint)(lVar6 == 4),"4 == archive_read_data(a, buff, 10)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'I',local_78,"buff","3333","\"3333\"",4,"4",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'J',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'K',(long)iVar1,"archive_read_has_encrypted_entries(a)",-2,
                      "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'N',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(local_a0);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
             ,L'O',"hhhhjjjjkkkkllll.o","\"hhhhjjjjkkkkllll.o\"",pcVar3,"archive_entry_pathname(ae)"
             ,(void *)0x0,L'\0');
  tVar4 = archive_entry_mtime(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'P',0x46102ef1,"1175465713",tVar4,"archive_entry_mtime(ae)",(void *)0x0);
  lVar5 = archive_entry_uid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'Q',0x3e9,"1001",lVar5,"archive_entry_uid(ae)",(void *)0x0);
  lVar5 = archive_entry_gid(local_a0);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'R',0,"0",lVar5,"archive_entry_gid(ae)",(void *)0x0);
  lVar5 = archive_entry_size(local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'S',(uint)(lVar5 == 9),"9 == archive_entry_size(ae)",(void *)0x0);
  lVar6 = archive_read_data((archive *)a,local_78,9);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'T',(uint)(lVar6 == 9),"9 == archive_read_data(a, buff, 9)",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'U',local_78,"buff","987654321","\"987654321\"",9,"9",(void *)0x0);
  iVar1 = archive_read_next_header((archive *)a,&local_a0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                   ,L'X',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'Y',4,"4",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'Z',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_ar.c"
                      ,L'[',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_ar)
{
	char buff[64];
	const char reffile[] = "test_read_format_ar.ar";
	struct archive_entry *ae;
	struct archive *a;

	extract_reference_file(reffile);
	assert((a = archive_read_new()) != NULL);
	assertA(0 == archive_read_support_filter_all(a));
	assertA(0 == archive_read_support_format_all(a));
	assertA(0 == archive_read_open_filename(a, reffile, 7));

	/* Filename table.  */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("//", archive_entry_pathname(ae));
	assertEqualInt(0, archive_entry_mtime(ae));
	assertEqualInt(0, archive_entry_uid(ae));
	assertEqualInt(0, archive_entry_gid(ae));
	assertEqualInt(0, archive_entry_size(ae));
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* First Entry */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("yyytttsssaaafff.o", archive_entry_pathname(ae));
	assertEqualInt(1175465652, archive_entry_mtime(ae));
	assertEqualInt(1001, archive_entry_uid(ae));
	assertEqualInt(0, archive_entry_gid(ae));
	assert(8 == archive_entry_size(ae));
	assertA(8 == archive_read_data(a, buff, 10));
	assertEqualMem(buff, "55667788", 8);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Second Entry */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("gghh.o", archive_entry_pathname(ae));
	assertEqualInt(1175465668, archive_entry_mtime(ae));
	assertEqualInt(1001, archive_entry_uid(ae));
	assertEqualInt(0, archive_entry_gid(ae));
	assert(4 == archive_entry_size(ae));
	assertA(4 == archive_read_data(a, buff, 10));
	assertEqualMem(buff, "3333", 4);
	assertEqualInt(archive_entry_is_encrypted(ae), 0);
	assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

	/* Third Entry */
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("hhhhjjjjkkkkllll.o", archive_entry_pathname(ae));
	assertEqualInt(1175465713, archive_entry_mtime(ae));
	assertEqualInt(1001, archive_entry_uid(ae));
	assertEqualInt(0, archive_entry_gid(ae));
	assert(9 == archive_entry_size(ae));
	assertA(9 == archive_read_data(a, buff, 9));
	assertEqualMem(buff, "987654321", 9);

	/* Test EOF */
	assertA(1 == archive_read_next_header(a, &ae));
	assertEqualInt(4, archive_file_count(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}